

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O0

bool __thiscall ON_Geometry::Translate(ON_Geometry *this,ON_3dVector *delta)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_a0 [8];
  ON_Xform tr;
  ON_3dVector *delta_local;
  ON_Geometry *this_local;
  
  tr.m_xform[3][3] = (double)delta;
  bVar1 = ON_3dVector::IsZero(delta);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = ON_3dVector::IsValid((ON_3dVector *)tr.m_xform[3][3]);
    if (bVar1) {
      ON_Xform::TranslationTransformation((ON_Xform *)local_a0,(ON_3dVector *)tr.m_xform[3][3]);
      uVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x1c])(this,local_a0);
      this_local._7_1_ = (uVar2 & 1) != 0;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Geometry::Translate( const ON_3dVector& delta )
{
  if ( delta.IsZero() )
    return true;
  if ( false == delta.IsValid() )
    return false;
  const ON_Xform tr(ON_Xform::TranslationTransformation( delta ));
  return (0!=Transform( tr ));
}